

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O1

void __thiscall Multi_Field_properties::test_method(Multi_Field_properties *this)

{
  bool bVar1;
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> MStack_2c0;
  Characteristic CStack_2bc;
  Characteristic *pCStack_2b8;
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> *pMStack_2b0;
  undefined **ppuStack_2a8;
  undefined1 uStack_2a0;
  undefined8 *puStack_298;
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> **ppMStack_290;
  undefined **ppuStack_288;
  ulong uStack_280;
  shared_count sStack_278;
  Characteristic **ppCStack_270;
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> MStack_268;
  int iStack_264;
  undefined8 uStack_260;
  shared_count sStack_258;
  undefined **ppuStack_250;
  char *pcStack_248;
  undefined8 *puStack_240;
  char *pcStack_238;
  Element_conflict EStack_22c;
  char *pcStack_228;
  char *pcStack_220;
  Element_conflict aEStack_218 [2];
  undefined1 *puStack_210;
  undefined1 *puStack_208;
  char *pcStack_200;
  char *pcStack_1f8;
  undefined1 *puStack_1f0;
  undefined1 *puStack_1e8;
  char *pcStack_1e0;
  char *pcStack_1d8;
  undefined1 *puStack_1d0;
  undefined1 *puStack_1c8;
  char *pcStack_1c0;
  char *pcStack_1b8;
  undefined1 *puStack_1b0;
  undefined1 *puStack_1a8;
  char *pcStack_1a0;
  char *pcStack_198;
  undefined1 *puStack_190;
  undefined1 *puStack_188;
  char *pcStack_180;
  char *pcStack_178;
  undefined1 *puStack_170;
  undefined1 *puStack_168;
  char *pcStack_160;
  char *pcStack_158;
  undefined1 *puStack_150;
  undefined1 *puStack_148;
  char *pcStack_140;
  char *pcStack_138;
  undefined1 *puStack_130;
  undefined1 *puStack_128;
  char *pcStack_120;
  char *pcStack_118;
  undefined1 *puStack_110;
  undefined1 *puStack_108;
  char *pcStack_100;
  char *pcStack_f8;
  undefined1 *puStack_f0;
  undefined1 *puStack_e8;
  char *pcStack_e0;
  char *pcStack_d8;
  char *pcStack_d0;
  char *pcStack_c8;
  undefined1 *puStack_c0;
  undefined1 *puStack_b8;
  char *pcStack_b0;
  char *pcStack_a8;
  char *pcStack_a0;
  char *pcStack_98;
  undefined1 *puStack_90;
  undefined1 *puStack_88;
  char *pcStack_80;
  char *pcStack_78;
  undefined1 *puStack_70;
  undefined1 *puStack_68;
  char *pcStack_60;
  char *pcStack_58;
  undefined1 *puStack_50;
  undefined1 *puStack_48;
  char *pcStack_40;
  char *pcStack_38;
  
  aEStack_218[0] = 1;
  EStack_22c = 7;
  pcStack_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_38 = "";
  puStack_50 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_40,0x1c2);
  pcStack_248 = (char *)((ulong)pcStack_248 & 0xffffffffffffff00);
  ppuStack_250 = &PTR__lazy_ostream_00132ae0;
  puStack_240 = &boost::unit_test::lazy_ostream::inst;
  pcStack_238 = "";
  Gudhi::persistence_fields::
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::get_partial_inverse
            ((Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> *)
             &ppuStack_2a8,(Characteristic)aEStack_218);
  pMStack_2b0 = &MStack_2c0;
  MStack_2c0.element_ = ppuStack_2a8._0_4_;
  pCStack_2b8 = &CStack_2bc;
  CStack_2bc = 1;
  bVar1 = ppuStack_2a8._0_4_ == 1;
  uStack_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  pcStack_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_220 = "";
  ppMStack_290 = &pMStack_2b0;
  uStack_2a0 = 0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132d20;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  ppCStack_270 = &pCStack_2b8;
  uStack_280 = uStack_280 & 0xffffffffffffff00;
  ppuStack_288 = &PTR__lazy_ostream_00132c20;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  MStack_268.element_._0_1_ = bVar1;
  boost::test_tools::tt_detail::report_assertion
            (&MStack_268,&ppuStack_250,&pcStack_228,0x1c2,1,2,2,"m1.get_inverse()",
             (Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> *)
             &ppuStack_2a8,"T(1)",&ppuStack_288);
  boost::detail::shared_count::~shared_count(&sStack_258);
  pcStack_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_58 = "";
  puStack_70 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_60,0x1c3);
  pcStack_248 = (char *)((ulong)pcStack_248 & 0xffffffffffffff00);
  ppuStack_250 = &PTR__lazy_ostream_00132ae0;
  puStack_240 = &boost::unit_test::lazy_ostream::inst;
  pcStack_238 = "";
  Gudhi::persistence_fields::
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::get_partial_inverse
            ((Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> *)
             &ppuStack_2a8,(Characteristic)&EStack_22c);
  MStack_2c0.element_ = ppuStack_2a8._0_4_;
  CStack_2bc = 0xac6;
  MStack_268.element_._0_1_ = ppuStack_2a8._0_4_ == 0xac6;
  uStack_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  pcStack_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_220 = "";
  pMStack_2b0 = &MStack_2c0;
  uStack_2a0 = 0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132d20;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  ppMStack_290 = &pMStack_2b0;
  pCStack_2b8 = &CStack_2bc;
  uStack_280 = uStack_280 & 0xffffffffffffff00;
  ppuStack_288 = &PTR__lazy_ostream_00132c20;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppCStack_270 = &pCStack_2b8;
  boost::test_tools::tt_detail::report_assertion
            (&MStack_268,&ppuStack_250,&pcStack_228,0x1c3,1,2,2,"m2.get_inverse()",
             (Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> *)
             &ppuStack_2a8,"T(2758)",&ppuStack_288);
  boost::detail::shared_count::~shared_count(&sStack_258);
  pcStack_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_78 = "";
  puStack_90 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_80,0x1c4);
  Gudhi::persistence_fields::
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::get_partial_inverse
            (&MStack_268,(Characteristic)aEStack_218);
  uStack_280 = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  ppuStack_250 = (undefined **)0x129b76;
  pcStack_248 = "";
  uStack_2a0 = 0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132be0;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  pcStack_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_98 = "";
  ppMStack_290 = (Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> **)
                 &ppuStack_250;
  ppuStack_288._0_1_ = iStack_264 == 0x23 && MStack_268.element_ == 0x6b4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_278);
  pcStack_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_a8 = "";
  puStack_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_b0,0x1c5);
  Gudhi::persistence_fields::
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::get_partial_inverse
            (&MStack_268,(Characteristic)&EStack_22c);
  ppuStack_288 = (undefined **)
                 CONCAT71(ppuStack_288._1_7_,iStack_264 == 5 && MStack_268.element_ == 0xbbb);
  uStack_280 = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  ppuStack_250 = (undefined **)0x129bb4;
  pcStack_248 = "";
  uStack_2a0 = 0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132be0;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  ppMStack_290 = (Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> **)
                 &ppuStack_250;
  pcStack_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_c8 = "";
  boost::test_tools::tt_detail::report_assertion
            (&ppuStack_288,&ppuStack_2a8,&pcStack_d0,0x1c5,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_278);
  pcStack_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_d8 = "";
  puStack_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_e0,0x1c7);
  pcStack_248 = (char *)((ulong)pcStack_248 & 0xffffffffffffff00);
  ppuStack_250 = &PTR__lazy_ostream_00132ae0;
  puStack_240 = &boost::unit_test::lazy_ostream::inst;
  pcStack_238 = "";
  MStack_2c0.element_ = 0;
  CStack_2bc = 0;
  uStack_2a0 = 0;
  uStack_280 = uStack_280 & 0xffffffffffffff00;
  MStack_268.element_._0_1_ = 1;
  uStack_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  ppuStack_288 = &PTR__lazy_ostream_00132c20;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppCStack_270 = &pCStack_2b8;
  pcStack_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_220 = "";
  pMStack_2b0 = &MStack_2c0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132d20;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  ppMStack_290 = &pMStack_2b0;
  pCStack_2b8 = &CStack_2bc;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  pcStack_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_f8 = "";
  puStack_110 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_100,0x1c8);
  pcStack_248 = (char *)((ulong)pcStack_248 & 0xffffffffffffff00);
  ppuStack_250 = &PTR__lazy_ostream_00132ae0;
  puStack_240 = &boost::unit_test::lazy_ostream::inst;
  pcStack_238 = "";
  MStack_2c0.element_ = 0;
  CStack_2bc = 0;
  MStack_268.element_._0_1_ = 1;
  uStack_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  pcStack_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_220 = "";
  pMStack_2b0 = &MStack_2c0;
  uStack_2a0 = 0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132d20;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  ppMStack_290 = &pMStack_2b0;
  pCStack_2b8 = &CStack_2bc;
  uStack_280 = uStack_280 & 0xffffffffffffff00;
  ppuStack_288 = &PTR__lazy_ostream_00132c20;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppCStack_270 = &pCStack_2b8;
  boost::test_tools::tt_detail::report_assertion
            (&MStack_268,&ppuStack_250,&pcStack_228,0x1c8,1,2,2,"m2.get_additive_identity()",
             &ppuStack_2a8,"T(0)",&ppuStack_288);
  boost::detail::shared_count::~shared_count(&sStack_258);
  pcStack_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_118 = "";
  puStack_130 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_120,0x1c9);
  pcStack_248 = (char *)((ulong)pcStack_248 & 0xffffffffffffff00);
  ppuStack_250 = &PTR__lazy_ostream_00132ae0;
  puStack_240 = &boost::unit_test::lazy_ostream::inst;
  pcStack_238 = "";
  MStack_2c0.element_ = 1;
  CStack_2bc = 1;
  MStack_268.element_._0_1_ = 1;
  uStack_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  pcStack_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_220 = "";
  pMStack_2b0 = &MStack_2c0;
  uStack_2a0 = 0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132d20;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  ppMStack_290 = &pMStack_2b0;
  pCStack_2b8 = &CStack_2bc;
  uStack_280 = uStack_280 & 0xffffffffffffff00;
  ppuStack_288 = &PTR__lazy_ostream_00132c20;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppCStack_270 = &pCStack_2b8;
  boost::test_tools::tt_detail::report_assertion
            (&MStack_268,&ppuStack_250,&pcStack_228,0x1c9,1,2,2,"m1.get_multiplicative_identity()",
             &ppuStack_2a8,"T(1)",&ppuStack_288);
  boost::detail::shared_count::~shared_count(&sStack_258);
  pcStack_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_138 = "";
  puStack_150 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_140,0x1ca);
  pcStack_248 = (char *)((ulong)pcStack_248 & 0xffffffffffffff00);
  ppuStack_250 = &PTR__lazy_ostream_00132ae0;
  puStack_240 = &boost::unit_test::lazy_ostream::inst;
  pcStack_238 = "";
  MStack_2c0.element_ = 1;
  CStack_2bc = 1;
  MStack_268.element_._0_1_ = 1;
  uStack_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  pcStack_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_220 = "";
  pMStack_2b0 = &MStack_2c0;
  uStack_2a0 = 0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132d20;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  ppMStack_290 = &pMStack_2b0;
  pCStack_2b8 = &CStack_2bc;
  uStack_280 = uStack_280 & 0xffffffffffffff00;
  ppuStack_288 = &PTR__lazy_ostream_00132c20;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppCStack_270 = &pCStack_2b8;
  boost::test_tools::tt_detail::report_assertion
            (&MStack_268,&ppuStack_250,&pcStack_228,0x1ca,1,2,2,"m2.get_multiplicative_identity()",
             &ppuStack_2a8,"T(1)",&ppuStack_288);
  boost::detail::shared_count::~shared_count(&sStack_258);
  pcStack_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_158 = "";
  puStack_170 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_160,0x1cb);
  pcStack_248 = (char *)((ulong)pcStack_248 & 0xffffffffffffff00);
  ppuStack_250 = &PTR__lazy_ostream_00132ae0;
  puStack_240 = &boost::unit_test::lazy_ostream::inst;
  pcStack_238 = "";
  CStack_2bc = 7;
  Gudhi::persistence_fields::
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::
  get_partial_multiplicative_identity(&MStack_2c0,&CStack_2bc);
  aEStack_218[1] = 0x2cb;
  MStack_268.element_._0_1_ = MStack_2c0.element_ == 0x2cb;
  uStack_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  pcStack_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_220 = "";
  uStack_2a0 = 0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132d20;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  ppMStack_290 = &pMStack_2b0;
  uStack_280 = uStack_280 & 0xffffffffffffff00;
  ppuStack_288 = &PTR__lazy_ostream_00132c20;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppCStack_270 = &pCStack_2b8;
  pCStack_2b8 = aEStack_218 + 1;
  pMStack_2b0 = &MStack_2c0;
  boost::test_tools::tt_detail::report_assertion
            (&MStack_268,&ppuStack_250,&pcStack_228,0x1cb,1,2,2,
             "m1.get_partial_multiplicative_identity(7)",&ppuStack_2a8,"T(715)",&ppuStack_288);
  boost::detail::shared_count::~shared_count(&sStack_258);
  pcStack_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_178 = "";
  puStack_190 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_180,0x1cc);
  pcStack_248 = (char *)((ulong)pcStack_248 & 0xffffffffffffff00);
  ppuStack_250 = &PTR__lazy_ostream_00132ae0;
  puStack_240 = &boost::unit_test::lazy_ostream::inst;
  pcStack_238 = "";
  CStack_2bc = 7;
  Gudhi::persistence_fields::
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::
  get_partial_multiplicative_identity(&MStack_2c0,&CStack_2bc);
  aEStack_218[1] = 0x2cb;
  MStack_268.element_._0_1_ = MStack_2c0.element_ == 0x2cb;
  uStack_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  pcStack_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_220 = "";
  pMStack_2b0 = &MStack_2c0;
  uStack_2a0 = 0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132d20;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  ppMStack_290 = &pMStack_2b0;
  uStack_280 = uStack_280 & 0xffffffffffffff00;
  ppuStack_288 = &PTR__lazy_ostream_00132c20;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppCStack_270 = &pCStack_2b8;
  pCStack_2b8 = aEStack_218 + 1;
  boost::test_tools::tt_detail::report_assertion
            (&MStack_268,&ppuStack_250,&pcStack_228,0x1cc,1,2,2,
             "m2.get_partial_multiplicative_identity(7)",&ppuStack_2a8,"T(715)",&ppuStack_288);
  boost::detail::shared_count::~shared_count(&sStack_258);
  pcStack_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_198 = "";
  puStack_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1a0,0x1ce);
  pcStack_248 = (char *)((ulong)pcStack_248 & 0xffffffffffffff00);
  ppuStack_250 = &PTR__lazy_ostream_00132ae0;
  puStack_240 = &boost::unit_test::lazy_ostream::inst;
  pcStack_238 = "";
  MStack_2c0.element_ = 0x138d;
  CStack_2bc = 0x138d;
  MStack_268.element_._0_1_ = 1;
  uStack_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  pcStack_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_220 = "";
  pMStack_2b0 = &MStack_2c0;
  uStack_2a0 = 0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132c20;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  ppMStack_290 = &pMStack_2b0;
  pCStack_2b8 = &CStack_2bc;
  uStack_280 = uStack_280 & 0xffffffffffffff00;
  ppuStack_288 = &PTR__lazy_ostream_00132aa0;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppCStack_270 = &pCStack_2b8;
  boost::test_tools::tt_detail::report_assertion
            (&MStack_268,&ppuStack_250,&pcStack_228,0x1ce,1,2,2,"m1.get_characteristic()",
             &ppuStack_2a8,"5005",&ppuStack_288);
  boost::detail::shared_count::~shared_count(&sStack_258);
  pcStack_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_1b8 = "";
  puStack_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1c0,0x1cf);
  pcStack_248 = (char *)((ulong)pcStack_248 & 0xffffffffffffff00);
  ppuStack_250 = &PTR__lazy_ostream_00132ae0;
  puStack_240 = &boost::unit_test::lazy_ostream::inst;
  pcStack_238 = "";
  MStack_2c0.element_ = 0x138d;
  CStack_2bc = 0x138d;
  MStack_268.element_._0_1_ = 1;
  uStack_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  pcStack_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_220 = "";
  pMStack_2b0 = &MStack_2c0;
  uStack_2a0 = 0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132c20;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  ppMStack_290 = &pMStack_2b0;
  pCStack_2b8 = &CStack_2bc;
  uStack_280 = uStack_280 & 0xffffffffffffff00;
  ppuStack_288 = &PTR__lazy_ostream_00132aa0;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppCStack_270 = &pCStack_2b8;
  boost::test_tools::tt_detail::report_assertion
            (&MStack_268,&ppuStack_250,&pcStack_228,0x1cf,1,2,2,"m2.get_characteristic()",
             &ppuStack_2a8,"5005",&ppuStack_288);
  boost::detail::shared_count::~shared_count(&sStack_258);
  pcStack_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_1d8 = "";
  puStack_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1e0,0x1d1);
  pcStack_248 = (char *)((ulong)pcStack_248 & 0xffffffffffffff00);
  ppuStack_250 = &PTR__lazy_ostream_00132ae0;
  puStack_240 = &boost::unit_test::lazy_ostream::inst;
  pcStack_238 = "";
  MStack_268.element_._0_1_ = aEStack_218[0] == 1;
  MStack_2c0.element_ = aEStack_218[0];
  CStack_2bc = 1;
  uStack_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  pcStack_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_220 = "";
  pMStack_2b0 = &MStack_2c0;
  uStack_2a0 = 0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132c20;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  ppMStack_290 = &pMStack_2b0;
  pCStack_2b8 = &CStack_2bc;
  uStack_280 = uStack_280 & 0xffffffffffffff00;
  ppuStack_288 = &PTR__lazy_ostream_00132aa0;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppCStack_270 = &pCStack_2b8;
  boost::test_tools::tt_detail::report_assertion
            (&MStack_268,&ppuStack_250,&pcStack_228,0x1d1,1,2,2,"m1.get_value()",&ppuStack_2a8,"1",
             &ppuStack_288);
  boost::detail::shared_count::~shared_count(&sStack_258);
  pcStack_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_1f8 = "";
  puStack_210 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_200,0x1d2);
  pcStack_248 = (char *)((ulong)pcStack_248 & 0xffffffffffffff00);
  ppuStack_250 = &PTR__lazy_ostream_00132ae0;
  puStack_240 = &boost::unit_test::lazy_ostream::inst;
  pcStack_238 = "";
  MStack_2c0.element_ = EStack_22c;
  MStack_268.element_._0_1_ = EStack_22c == 7;
  CStack_2bc = 7;
  uStack_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  pcStack_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_220 = "";
  pMStack_2b0 = &MStack_2c0;
  uStack_2a0 = 0;
  ppuStack_2a8 = &PTR__lazy_ostream_00132c20;
  puStack_298 = &boost::unit_test::lazy_ostream::inst;
  ppMStack_290 = &pMStack_2b0;
  pCStack_2b8 = &CStack_2bc;
  uStack_280 = uStack_280 & 0xffffffffffffff00;
  ppuStack_288 = &PTR__lazy_ostream_00132aa0;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  ppCStack_270 = &pCStack_2b8;
  boost::test_tools::tt_detail::report_assertion
            (&MStack_268,&ppuStack_250,&pcStack_228,0x1d2,1,2,2,"m2.get_value()",&ppuStack_2a8,"7",
             &ppuStack_288);
  boost::detail::shared_count::~shared_count(&sStack_258);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Multi_Field_properties) {
  test_multi_field_properties<Multi_field_element_with_small_characteristics<5, 13> >();
#ifdef PM_GMP_FOUND
  test_multi_field_properties<Multi_field_element<5, 13> >();

  Multi_field_element<3, 30> mb1(2);
  Multi_field_element_with_small_characteristics<3, 30> mb2(2);

  BOOST_CHECK_EQUAL(mb1.get_characteristic(), mb2.get_characteristic());  // == 3234846615
  BOOST_CHECK_EQUAL(mb1.get_partial_inverse(35).first.get_value(),
                    mb2.get_partial_inverse(35).first.get_value());  // == 2033332158
#endif
}